

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-dark.c
# Opt level: O0

_Bool borg_flow_dark(_Bool neer)

{
  loc grid1;
  _Bool _Var1;
  wchar_t wVar2;
  loc grid2;
  int local_24;
  wchar_t local_20;
  int b_stair;
  int b_j;
  int j;
  int y;
  int x;
  int i;
  _Bool neer_local;
  
  local_20 = L'\xffffffff';
  local_24 = -1;
  if (((!borg_morgoth_position) || (!morgoth_on_level)) &&
     (_Var1 = borg_flow_dark_interesting(borg.c.y,borg.c.x,-1), !_Var1)) {
    for (y = 0; y < track_less.num; y = y + 1) {
      grid2 = loc(track_less.x[y],track_less.y[y]);
      grid1.y = borg.c.y;
      grid1.x = borg.c.x;
      wVar2 = distance(grid1,grid2);
      if (local_20 < wVar2) {
        local_24 = y;
        local_20 = wVar2;
      }
    }
    if (neer) {
      _Var1 = borg_flow_dark_1(local_24);
      if (_Var1) {
        return true;
      }
      _Var1 = borg_flow_dark_2(local_24);
      if (_Var1) {
        return true;
      }
      _Var1 = borg_flow_dark_3(local_24);
      if (_Var1) {
        return true;
      }
    }
    else {
      _Var1 = borg_flow_dark_4(local_24);
      if (_Var1) {
        return true;
      }
      _Var1 = borg_flow_dark_5(local_24);
      if (_Var1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool borg_flow_dark(bool neer)
{
    int i;
    int x, y, j, b_j = -1;
    int b_stair = -1;

    /* Not if sitting in a sea of runes and we saw Morgoth recently */
    if (borg_morgoth_position && morgoth_on_level)
        return false;

    /* Paranoia */
    if (borg_flow_dark_interesting(borg.c.y, borg.c.x, -1)) {
        return false;
    }

    /* Check distance away from stairs, used later */
    /* Check for an existing "up stairs" */
    for (i = 0; i < track_less.num; i++) {
        x = track_less.x[i];
        y = track_less.y[i];

        /* How far is the nearest up stairs */
        j = distance(borg.c, loc(x, y));

        /* skip the closer ones */
        if (b_j >= j)
            continue;

        /* track it */
        b_j     = j;
        b_stair = i;
    }

    /* Near */
    if (neer) {
        /* Method 1 */
        if (borg_flow_dark_1(b_stair))
            return true;

        /* Method 2 */
        if (borg_flow_dark_2(b_stair))
            return true;

        /* Method 3 */
        if (borg_flow_dark_3(b_stair))
            return true;
    }
    /* Far */
    else {
        /* Method 4 */
        if (borg_flow_dark_4(b_stair))
            return true;

        /* Method 5 */
        if (borg_flow_dark_5(b_stair))
            return true;
    }

    /* Fail */
    return false;
}